

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlsio_openssl.c
# Opt level: O0

int tlsio_openssl_send(CONCRETE_IO_HANDLE tls_io,void *buffer,size_t size,
                      ON_SEND_COMPLETE on_send_complete,void *callback_context)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  int res;
  LOGGER_LOG l_1;
  TLS_IO_INSTANCE *tls_io_instance;
  LOGGER_LOG l;
  int result;
  void *callback_context_local;
  ON_SEND_COMPLETE on_send_complete_local;
  size_t size_local;
  void *buffer_local;
  CONCRETE_IO_HANDLE tls_io_local;
  
  if (tls_io == (CONCRETE_IO_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/deps/c-utility/adapters/tlsio_openssl.c"
                ,"tlsio_openssl_send",0x604,1,"NULL tls_io.");
    }
    l._4_4_ = 0x605;
  }
  else if (*(int *)((long)tls_io + 0x68) == 4) {
    if (*(long *)((long)tls_io + 0x48) == 0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/deps/c-utility/adapters/tlsio_openssl.c"
                  ,"tlsio_openssl_send",0x615,1,"SSL channel closed in tlsio_openssl_send.");
      }
      return 0x616;
    }
    iVar1 = SSL_write(*(SSL **)((long)tls_io + 0x48),buffer,(int)size);
    if (iVar1 == (int)size) {
      iVar1 = write_outgoing_bytes((TLS_IO_INSTANCE *)tls_io,on_send_complete,callback_context);
      if (iVar1 == 0) {
        l._4_4_ = 0;
      }
      else {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/deps/c-utility/adapters/tlsio_openssl.c"
                    ,"tlsio_openssl_send",0x624,1,"Error in write_outgoing_bytes.");
        }
        l._4_4_ = 0x625;
      }
    }
    else {
      log_ERR_get_error("SSL_write error.");
      l._4_4_ = 0x61e;
    }
  }
  else {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/deps/c-utility/adapters/tlsio_openssl.c"
                ,"tlsio_openssl_send",0x60d,1,
                "Invalid tlsio_state. Expected state is TLSIO_STATE_OPEN.");
    }
    l._4_4_ = 0x60e;
  }
  return l._4_4_;
}

Assistant:

int tlsio_openssl_send(CONCRETE_IO_HANDLE tls_io, const void* buffer, size_t size, ON_SEND_COMPLETE on_send_complete, void* callback_context)
{
    int result;

    if (tls_io == NULL)
    {
        LogError("NULL tls_io.");
        result = MU_FAILURE;
    }
    else
    {
        TLS_IO_INSTANCE* tls_io_instance = (TLS_IO_INSTANCE*)tls_io;

        if (tls_io_instance->tlsio_state != TLSIO_STATE_OPEN)
        {
            LogError("Invalid tlsio_state. Expected state is TLSIO_STATE_OPEN.");
            result = MU_FAILURE;
        }
        else
        {
            int res;
            if (tls_io_instance->ssl == NULL)
            {
                LogError("SSL channel closed in tlsio_openssl_send.");
                result = MU_FAILURE;
                return result;
            }

            res = SSL_write(tls_io_instance->ssl, buffer, (int)size);
            if (res != (int)size)
            {
                log_ERR_get_error("SSL_write error.");
                result = MU_FAILURE;
            }
            else
            {
                if (write_outgoing_bytes(tls_io_instance, on_send_complete, callback_context) != 0)
                {
                    LogError("Error in write_outgoing_bytes.");
                    result = MU_FAILURE;
                }
                else
                {
                    result = 0;
                }
            }
        }
    }

    return result;
}